

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapNodeAreaRefed(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  Ivy_Supp_t *pIVar2;
  int aResult2;
  int aResult;
  Ivy_Supp_t *pSupp;
  Ivy_Obj_t *pObj_local;
  Ivy_Man_t *pAig_local;
  
  iVar1 = Ivy_ObjIsCi(pObj);
  if (iVar1 == 0) {
    iVar1 = Ivy_ObjIsNode(pObj);
    if (iVar1 == 0) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x414,"int Ivy_FastMapNodeAreaRefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    pIVar2 = Ivy_ObjSupp(pAig,pObj);
    if (pIVar2->nRefs < 1) {
      __assert_fail("pSupp->nRefs > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x416,"int Ivy_FastMapNodeAreaRefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
    pAig_local._4_4_ = Ivy_FastMapNodeDeref(pAig,pObj);
    iVar1 = Ivy_FastMapNodeRef(pAig,pObj);
    if (pAig_local._4_4_ != iVar1) {
      __assert_fail("aResult == aResult2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFastMap.c"
                    ,0x419,"int Ivy_FastMapNodeAreaRefed(Ivy_Man_t *, Ivy_Obj_t *)");
    }
  }
  else {
    pAig_local._4_4_ = 0;
  }
  return pAig_local._4_4_;
}

Assistant:

int Ivy_FastMapNodeAreaRefed( Ivy_Man_t * pAig, Ivy_Obj_t * pObj )
{
    Ivy_Supp_t * pSupp;
    int aResult, aResult2;
    if ( Ivy_ObjIsCi(pObj) )
        return 0;
    assert( Ivy_ObjIsNode(pObj) );
    pSupp = Ivy_ObjSupp( pAig, pObj );
    assert( pSupp->nRefs > 0 );
    aResult  = Ivy_FastMapNodeDeref( pAig, pObj );
    aResult2 = Ivy_FastMapNodeRef( pAig, pObj );
    assert( aResult == aResult2 );
    return aResult;
}